

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetBlindTxBlindData
              (void *handle,void *blind_handle,uint32_t index,uint32_t *vout,char **asset,
              int64_t *value_satoshi,char **asset_blind_factor,char **value_blind_factor,
              char **issuance_txid,uint32_t *issuance_vout,bool *is_issuance_asset,
              bool *is_issuance_token)

{
  long *plVar1;
  uint32_t uVar2;
  int64_t iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  CfdException *pCVar7;
  uint32_t *puVar8;
  Amount AVar9;
  undefined1 local_a0 [8];
  int local_98;
  char *local_90;
  void *local_80;
  char *local_78;
  char *work_value_blind_factor;
  char *work_asset_blind_factor;
  char *work_asset;
  Txid local_58;
  undefined8 local_38;
  
  work_asset = (char *)0x0;
  work_asset_blind_factor = (char *)0x0;
  work_value_blind_factor = (char *)0x0;
  local_38 = 0;
  local_80 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_a0,"BlindTxData",(allocator *)&local_58);
  cfd::capi::CheckBuffer(blind_handle,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  plVar1 = *(long **)((long)blind_handle + 0x38);
  if (plVar1 == (long *)0x0) {
    local_a0 = (undefined1  [8])0x4fbb12;
    local_98 = 0x5b5;
    local_90 = "CfdGetBlindTxBlindData";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_a0,"buffer state is illegal.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_a0,"Failed to parameter. buffer state is illegal.",
               (allocator *)&local_58);
    cfd::core::CfdException::CfdException(pCVar7,kCfdOutOfRangeError,(string *)local_a0);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(char *)((long)blind_handle + 0x30) != '\0') {
    if ((ulong)index < (ulong)((plVar1[1] - *plVar1) / 200)) {
      puVar8 = (uint32_t *)(*plVar1 + (ulong)index * 200);
      if (vout != (uint32_t *)0x0) {
        *vout = *puVar8;
      }
      if (asset == (char **)0x0) {
        local_78 = (char *)0x0;
      }
      else {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                  ((string *)local_a0,(ConfidentialAssetId *)(puVar8 + 2));
        local_78 = cfd::capi::CreateString((string *)local_a0);
        work_asset = local_78;
        std::__cxx11::string::~string((string *)local_a0);
      }
      if (value_satoshi != (int64_t *)0x0) {
        AVar9 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)(puVar8 + 0x1c));
        local_a0 = (undefined1  [8])AVar9.amount_;
        local_98 = CONCAT31(local_98._1_3_,AVar9.ignore_check_);
        iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_a0);
        *value_satoshi = iVar3;
      }
      if (asset_blind_factor == (char **)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_a0,(BlindFactor *)(puVar8 + 0xc));
        pcVar4 = cfd::capi::CreateString((string *)local_a0);
        work_asset_blind_factor = pcVar4;
        std::__cxx11::string::~string((string *)local_a0);
      }
      if (value_blind_factor == (char **)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_a0,(BlindFactor *)(puVar8 + 0x14))
        ;
        pcVar5 = cfd::capi::CreateString((string *)local_a0);
        work_value_blind_factor = pcVar5;
        std::__cxx11::string::~string((string *)local_a0);
      }
      if (issuance_vout == (uint32_t *)0x0 || issuance_txid == (char **)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        uVar2 = cfd::core::OutPoint::GetVout((OutPoint *)(puVar8 + 0x26));
        *issuance_vout = uVar2;
        cfd::core::OutPoint::GetTxid(&local_58,(OutPoint *)(puVar8 + 0x26));
        cfd::core::Txid::GetHex_abi_cxx11_((string *)local_a0,&local_58);
        pcVar6 = cfd::capi::CreateString((string *)local_a0);
        std::__cxx11::string::~string((string *)local_a0);
        cfd::core::Txid::~Txid(&local_58);
      }
      if (is_issuance_asset != (bool *)0x0) {
        *is_issuance_asset = SUB41(puVar8[0x30],0);
      }
      if (is_issuance_token != (bool *)0x0) {
        *is_issuance_token = *(bool *)((long)puVar8 + 0xc1);
      }
      if (local_78 != (char *)0x0) {
        *asset = local_78;
      }
      if (pcVar4 != (char *)0x0) {
        *asset_blind_factor = pcVar4;
      }
      if (pcVar5 != (char *)0x0) {
        *value_blind_factor = pcVar5;
      }
      if (pcVar6 != (char *)0x0) {
        *issuance_txid = pcVar6;
      }
      return 0;
    }
    local_a0 = (undefined1  [8])0x4fbb12;
    local_98 = 0x5c1;
    local_90 = "CfdGetBlindTxBlindData";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_a0,"index out of range.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_a0,"Failed to parameter. index out of range.",(allocator *)&local_58)
    ;
    cfd::core::CfdException::CfdException(pCVar7,kCfdOutOfRangeError,(string *)local_a0);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a0 = (undefined1  [8])0x4fbb12;
  local_98 = 0x5bb;
  local_90 = "CfdGetBlindTxBlindData";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_a0,"unused collect blinder.");
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_a0,"Failed to collect state. unused collect blinder.",
             (allocator *)&local_58);
  cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_a0);
  __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetBlindTxBlindData(
    void* handle, void* blind_handle, uint32_t index, uint32_t* vout,
    char** asset, int64_t* value_satoshi, char** asset_blind_factor,
    char** value_blind_factor, char** issuance_txid, uint32_t* issuance_vout,
    bool* is_issuance_asset, bool* is_issuance_token) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_value_blind_factor = nullptr;
  char* work_txid = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(blind_handle, kPrefixBlindTxData);

    CfdCapiBlindTxData* buffer =
        static_cast<CfdCapiBlindTxData*>(blind_handle);
    if (buffer->blinder_list == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }
    if (!buffer->has_collect_blinder) {
      warn(CFD_LOG_SOURCE, "unused collect blinder.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to collect state. unused collect blinder.");
    }
    if (index >= buffer->blinder_list->size()) {
      warn(CFD_LOG_SOURCE, "index out of range.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index out of range.");
    }

    auto& data = (*buffer->blinder_list)[index];
    if (vout != nullptr) *vout = data.vout;
    if (asset != nullptr) {
      work_asset = CreateString(data.asset.GetHex());
    }
    if (value_satoshi != nullptr) {
      *value_satoshi = data.value.GetAmount().GetSatoshiValue();
    }
    if (asset_blind_factor != nullptr) {
      work_asset_blind_factor = CreateString(data.abf.GetHex());
    }
    if (value_blind_factor != nullptr) {
      work_value_blind_factor = CreateString(data.vbf.GetHex());
    }
    if ((issuance_txid != nullptr) && (issuance_vout != nullptr)) {
      *issuance_vout = data.issuance_outpoint.GetVout();
      work_txid = CreateString(data.issuance_outpoint.GetTxid().GetHex());
    }
    if (is_issuance_asset != nullptr) *is_issuance_asset = data.is_issuance;
    if (is_issuance_token != nullptr) {
      *is_issuance_token = data.is_issuance_token;
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_value_blind_factor != nullptr)
      *value_blind_factor = work_value_blind_factor;
    if (work_txid != nullptr) *issuance_txid = work_txid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_asset, &work_asset_blind_factor);
  FreeBufferOnError(&work_value_blind_factor, &work_txid);
  return result;
}